

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeSetStepDirection(void *arkode_mem,sunrealtype stepdir)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  double dVar2;
  double dVar3;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x54c;
    goto LAB_0013b94a;
  }
  if (*(int *)((long)arkode_mem + 0x3c4) == 0) {
    msgfmt = "Step direction cannot be specified after module initialization.";
    error_code = -0x34;
    iVar1 = 0x556;
    goto LAB_0013b94a;
  }
  if ((stepdir == 0.0) && (!NAN(stepdir))) goto LAB_0013b911;
  if (*(int *)((long)arkode_mem + 0x300) == 0) {
    dVar3 = *(double *)((long)arkode_mem + 0x2c0);
    if ((dVar3 == 0.0) && (!NAN(dVar3))) goto LAB_0013b846;
  }
  else {
LAB_0013b846:
    dVar3 = *(double *)((long)arkode_mem + 0x2b8);
  }
  dVar2 = (double)((ulong)ABS(dVar3) | (ulong)stepdir & 0x8000000000000000);
  if ((dVar3 != dVar2) || (NAN(dVar3) || NAN(dVar2))) {
    *(undefined8 *)((long)arkode_mem + 0x378) = 0;
    *(double *)((long)arkode_mem + 0x2c0) = -dVar3;
    dVar2 = 0.0;
    if (*(int *)((long)arkode_mem + 0x300) != 0) {
      dVar2 = -dVar3;
    }
    *(double *)((long)arkode_mem + 0x2b8) = dVar2;
    if (((*(long *)((long)arkode_mem + 0x308) != 0) &&
        (*(long *)(*(long *)((long)arkode_mem + 0x308) + 0x68) != 0)) &&
       (iVar1 = SUNAdaptController_Reset(), iVar1 != 0)) {
      msgfmt = "Unable to reset error controller object";
      error_code = -0x2f;
      iVar1 = 0x57d;
LAB_0013b94a:
      arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetStepDirection",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                      ,msgfmt);
      return error_code;
    }
  }
LAB_0013b911:
  if (*(code **)((long)arkode_mem + 0xf8) == (code *)0x0) {
    return 0;
  }
  iVar1 = (**(code **)((long)arkode_mem + 0xf8))(stepdir,arkode_mem);
  return iVar1;
}

Assistant:

int ARKodeSetStepDirection(void* arkode_mem, sunrealtype stepdir)
{
  /* stepdir is a sunrealtype because the direction typically comes from a time
   * step h or tend-tstart which are sunrealtypes. If stepdir was in int,
   * conversions would be required which can cause undefined behavior when
   * greater than MAX_INT */
  int retval;
  ARKodeMem ark_mem;
  sunrealtype h;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return ARK_MEM_NULL;
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* do not change direction once the module has been initialized i.e., after calling
     ARKodeEvolve unless ReInit or Reset are called. */
  if (!ark_mem->initsetup)
  {
    arkProcessError(ark_mem, ARK_STEP_DIRECTION_ERR, __LINE__, __func__,
                    __FILE__, "Step direction cannot be specified after module initialization.");
    return ARK_STEP_DIRECTION_ERR;
  }

  if (stepdir != ZERO)
  {
    retval = ARKodeGetStepDirection(arkode_mem, &h);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                      "Unable to access step direction");
      return retval;
    }

    if (h != SUNRcopysign(h, stepdir))
    {
      /* Reverse the sign of h. If adaptive, h will be overwritten anyway by the
       * initial step estimation since ARKodeReset must be called before this.
       * However, the sign of h will be used to check if the integration
       * direction and stop time are consistent, e.g., in ARKodeSetStopTime, so
       * we should not set h = 0. */
      ark_mem->h = -h;
      /* Clear previous initial step and force an initial step recomputation.
       * Normally, this would not occur after a reset, but it is necessary here
       * because the timestep used in one direction may not be suitable for the
       * other */
      ark_mem->h0u = ZERO;
      /* Reverse the step if in fixed mode. If adaptive, reset to 0 to clear any
       * old value from a call to ARKodeSetInit */
      ark_mem->hin = ark_mem->fixedstep ? -h : ZERO;

      /* Reset error controller (e.g., error and step size history) */
      if (ark_mem->hadapt_mem && ark_mem->hadapt_mem->hcontroller)
      {
        SUNErrCode err =
          SUNAdaptController_Reset(ark_mem->hadapt_mem->hcontroller);
        if (err != SUN_SUCCESS)
        {
          arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                          __FILE__, "Unable to reset error controller object");
          return ARK_CONTROLLER_ERR;
        }
      }
    }
  }

  if (ark_mem->step_setstepdirection != NULL)
  {
    return ark_mem->step_setstepdirection(ark_mem, stepdir);
  }

  return ARK_SUCCESS;
}